

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_poll(LIBSSH2_POLLFD *fds,uint nfds,long timeout)

{
  ulong *puVar1;
  byte *pbVar2;
  uchar uVar3;
  short sVar4;
  ulong uVar5;
  ulong __nfds;
  int iVar6;
  void *pvVar7;
  long lVar8;
  LIBSSH2_SESSION *pLVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  LIBSSH2_SESSION *session;
  timeval tv_end;
  timeval tv_begin;
  pollfd sockets [256];
  timeval local_858;
  timeval local_848;
  pollfd local_838 [257];
  
  iVar11 = -1;
  if (nfds < 0x101) {
    __nfds = (ulong)nfds;
    if (nfds != 0) {
      lVar8 = 0;
      session = (LIBSSH2_SESSION *)0x0;
      do {
        *(undefined8 *)((long)&fds->revents + lVar8 * 4) = 0;
        uVar3 = (&fds->type)[lVar8 * 4];
        if (uVar3 == '\x03') {
          pLVar9 = *(LIBSSH2_SESSION **)(*(long *)((long)&fds->fd + lVar8 * 4) + 0x18);
LAB_0011b0a9:
          *(libssh2_socket_t *)((long)&local_838[0].fd + lVar8) = pLVar9->socket_fd;
          *(undefined4 *)((long)&local_838[0].events + lVar8) = 1;
          if (session == (LIBSSH2_SESSION *)0x0) {
            session = pLVar9;
          }
        }
        else {
          if (uVar3 == '\x02') {
            pLVar9 = *(LIBSSH2_SESSION **)(*(long *)((long)&fds->fd + lVar8 * 4) + 0x60);
            goto LAB_0011b0a9;
          }
          if (uVar3 != '\x01') {
            if (session == (LIBSSH2_SESSION *)0x0) {
              return -1;
            }
            _libssh2_error(session,-0x23,"Invalid descriptor passed to libssh2_poll()");
            return -1;
          }
          *(undefined4 *)((long)&local_838[0].fd + lVar8) =
               *(undefined4 *)((long)&fds->fd + lVar8 * 4);
          *(undefined2 *)((long)&local_838[0].events + lVar8) =
               *(undefined2 *)((long)&fds->events + lVar8 * 4);
          *(undefined2 *)((long)&local_838[0].revents + lVar8) = 0;
        }
        lVar8 = lVar8 + 8;
      } while (__nfds * 8 - lVar8 != 0);
    }
    do {
      iVar11 = 0;
      if (nfds != 0) {
        lVar8 = 0;
        iVar11 = 0;
        do {
          uVar12 = *(ulong *)((long)&fds->events + lVar8);
          uVar5 = *(ulong *)((long)&fds->revents + lVar8);
          if (uVar12 != uVar5) {
            if ((&fds->type)[lVar8] == '\x03') {
              if ((uVar5 & 1) == 0 && (uVar12 & 1) != 0) {
                pvVar7 = _libssh2_list_first((list_head *)(*(long *)((long)&fds->fd + lVar8) + 0x30)
                                            );
                puVar1 = (ulong *)((long)&fds->revents + lVar8);
                *puVar1 = *puVar1 | (ulong)(pvVar7 != (void *)0x0);
              }
              lVar10 = *(long *)(*(long *)((long)&fds->fd + lVar8) + 0x18);
            }
            else {
              if ((&fds->type)[lVar8] != '\x02') goto LAB_0011b1f2;
              if ((uVar5 & 1) == 0 && (uVar12 & 1) != 0) {
                iVar6 = libssh2_poll_channel_read(*(LIBSSH2_CHANNEL **)((long)&fds->fd + lVar8),0);
                puVar1 = (ulong *)((long)&fds->revents + lVar8);
                *puVar1 = *puVar1 | (ulong)(iVar6 != 0);
              }
              if (((*(byte *)((long)&fds->events + lVar8) & 2) != 0) &&
                 ((*(byte *)((long)&fds->revents + lVar8) & 2) == 0)) {
                iVar6 = libssh2_poll_channel_read(*(LIBSSH2_CHANNEL **)((long)&fds->fd + lVar8),1);
                puVar1 = (ulong *)((long)&fds->revents + lVar8);
                *puVar1 = *puVar1 | (ulong)((uint)(iVar6 != 0) * 2);
              }
              if (((*(byte *)((long)&fds->events + lVar8) & 4) != 0) &&
                 (uVar12 = *(ulong *)((long)&fds->revents + lVar8), (uVar12 & 4) == 0)) {
                *(ulong *)((long)&fds->revents + lVar8) =
                     uVar12 + (ulong)(*(int *)(*(long *)((long)&fds->fd + lVar8) + 0x38) != 0) * 4;
              }
              lVar10 = *(long *)((long)&fds->fd + lVar8);
              if ((*(char *)(lVar10 + 0x54) != '\0') || (*(char *)(lVar10 + 0x40) != '\0')) {
                pbVar2 = (byte *)((long)&fds->revents + lVar8);
                *pbVar2 = *pbVar2 | 0x80;
              }
              lVar10 = *(long *)(*(long *)((long)&fds->fd + lVar8) + 0x60);
            }
            if (*(int *)(lVar10 + 0x204) == -1) {
              pbVar2 = (byte *)((long)&fds->revents + lVar8);
              *pbVar2 = *pbVar2 | 0x90;
            }
          }
LAB_0011b1f2:
          iVar11 = (iVar11 + 1) - (uint)(*(long *)((long)&fds->revents + lVar8) == 0);
          lVar8 = lVar8 + 0x20;
        } while (__nfds << 5 != lVar8);
      }
      if (iVar11 != 0) {
        timeout = 0;
      }
      gettimeofday(&local_848,(__timezone_ptr_t)0x0);
      iVar6 = poll(local_838,__nfds,(int)timeout);
      gettimeofday(&local_858,(__timezone_ptr_t)0x0);
      lVar10 = SUB168(SEXT816(local_858.tv_usec - local_848.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),
                      8);
      lVar8 = local_858.tv_sec - local_848.tv_sec;
      if (0 < iVar6 && nfds != 0) {
        uVar12 = 0;
        do {
          uVar3 = fds[uVar12].type;
          if (uVar3 == '\x03') {
            if ((local_838[uVar12].events & 1) != 0) {
              do {
                iVar6 = _libssh2_transport_read((fds[uVar12].fd.listener)->session);
              } while (0 < iVar6);
            }
LAB_0011b2f2:
            if ((local_838[uVar12].revents & 0x10) != 0) {
              *(byte *)&fds[uVar12].revents = (byte)fds[uVar12].revents | 0x90;
            }
            local_838[uVar12].revents = 0;
          }
          else {
            if (uVar3 == '\x02') {
              if ((local_838[uVar12].events & 1) != 0) {
                do {
                  iVar6 = _libssh2_transport_read((fds[uVar12].fd.channel)->session);
                } while (0 < iVar6);
              }
              goto LAB_0011b2f2;
            }
            if (uVar3 == '\x01') {
              sVar4 = local_838[uVar12].revents;
              fds[uVar12].revents = (long)sVar4;
              local_838[uVar12].revents = 0;
              iVar11 = (iVar11 + 1) - (uint)((long)sVar4 == 0);
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != __nfds);
      }
      timeout = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + lVar8 * -1000 + timeout;
    } while ((0 < timeout) && (iVar11 == 0));
  }
  return iVar11;
}

Assistant:

LIBSSH2_API int
libssh2_poll(LIBSSH2_POLLFD * fds, unsigned int nfds, long timeout)
{
    long timeout_remaining;
    unsigned int i, active_fds;
#ifdef HAVE_POLL
    LIBSSH2_SESSION *session = NULL;
#ifdef HAVE_ALLOCA
    struct pollfd *sockets = alloca(sizeof(struct pollfd) * nfds);
#else
    struct pollfd sockets[256];

    if (nfds > 256)
        /* systems without alloca use a fixed-size array, this can be fixed if
           we really want to, at least if the compiler is a C99 capable one */
        return -1;
#endif
    /* Setup sockets for polling */
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch (fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            sockets[i].fd = fds[i].fd.socket;
            sockets[i].events = fds[i].events;
            sockets[i].revents = 0;
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            sockets[i].fd = fds[i].fd.channel->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if (!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            sockets[i].fd = fds[i].fd.listener->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if (!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if (session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#elif defined(HAVE_SELECT)
    LIBSSH2_SESSION *session = NULL;
    libssh2_socket_t maxfd = 0;
    fd_set rfds, wfds;
    struct timeval tv;

    FD_ZERO(&rfds);
    FD_ZERO(&wfds);
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch (fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            if (fds[i].events & LIBSSH2_POLLFD_POLLIN) {
                FD_SET(fds[i].fd.socket, &rfds);
                if (fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            if (fds[i].events & LIBSSH2_POLLFD_POLLOUT) {
                FD_SET(fds[i].fd.socket, &wfds);
                if (fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            FD_SET(fds[i].fd.channel->session->socket_fd, &rfds);
            if (fds[i].fd.channel->session->socket_fd > maxfd)
                maxfd = fds[i].fd.channel->session->socket_fd;
            if (!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            FD_SET(fds[i].fd.listener->session->socket_fd, &rfds);
            if (fds[i].fd.listener->session->socket_fd > maxfd)
                maxfd = fds[i].fd.listener->session->socket_fd;
            if (!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if (session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#else
    /* No select() or poll()
     * no sockets structure to setup
     */

    timeout = 0;
#endif /* HAVE_POLL or HAVE_SELECT */

    timeout_remaining = timeout;
    do {
#if defined(HAVE_POLL) || defined(HAVE_SELECT)
        int sysret;
#endif

        active_fds = 0;

        for(i = 0; i < nfds; i++) {
            if (fds[i].events != fds[i].revents) {
                switch (fds[i].type) {
                case LIBSSH2_POLLFD_CHANNEL:
                    if ((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want to be ready for read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* Not yet known to be ready for read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      0) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if ((fds[i].events & LIBSSH2_POLLFD_POLLEXT) &&
                        /* Want to be ready for extended read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLEXT) == 0)) {
                        /* Not yet known to be ready for extended read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      1) ?
                            LIBSSH2_POLLFD_POLLEXT : 0;
                    }
                    if ((fds[i].events & LIBSSH2_POLLFD_POLLOUT) &&
                        /* Want to be ready for write */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLOUT) == 0)) {
                        /* Not yet known to be ready for write */
                        fds[i].revents |=
                            poll_channel_write(fds[i].fd. channel) ?
                            LIBSSH2_POLLFD_POLLOUT : 0;
                    }
                    if (fds[i].fd.channel->remote.close
                        || fds[i].fd.channel->local.close) {
                        fds[i].revents |= LIBSSH2_POLLFD_CHANNEL_CLOSED;
                    }
                    if (fds[i].fd.channel->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if ((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want a connection */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* No connections known of yet */
                        fds[i].revents |=
                            poll_listener_queued(fds[i].fd. listener) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if (fds[i].fd.listener->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;
                }
            }
            if (fds[i].revents) {
                active_fds++;
            }
        }

        if (active_fds) {
            /* Don't block on the sockets if we have channels/listeners which
               are ready */
            timeout_remaining = 0;
        }
#ifdef HAVE_POLL

#ifdef HAVE_LIBSSH2_GETTIMEOFDAY
        {
            struct timeval tv_begin, tv_end;

            _libssh2_gettimeofday((struct timeval *) &tv_begin, NULL);
            sysret = poll(sockets, nfds, timeout_remaining);
            _libssh2_gettimeofday((struct timeval *) &tv_end, NULL);
            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }
#else
        /* If the platform doesn't support gettimeofday,
         * then just make the call non-blocking and walk away
         */
        sysret = poll(sockets, nfds, timeout_remaining);
        timeout_remaining = 0;
#endif /* HAVE_GETTIMEOFDAY */

        if (sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch (fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    fds[i].revents = sockets[i].revents;
                    sockets[i].revents = 0; /* In case we loop again, be nice */
                    if (fds[i].revents) {
                        active_fds++;
                    }
                    break;
                case LIBSSH2_POLLFD_CHANNEL:
                    if (sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while (_libssh2_transport_read(fds[i].fd.channel->session)
                               > 0);
                    }
                    if (sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                case LIBSSH2_POLLFD_LISTENER:
                    if (sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while (_libssh2_transport_read(fds[i].fd.listener->session)
                               > 0);
                    }
                    if (sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                }
            }
        }
#elif defined(HAVE_SELECT)
        tv.tv_sec = timeout_remaining / 1000;
        tv.tv_usec = (timeout_remaining % 1000) * 1000;
#ifdef HAVE_LIBSSH2_GETTIMEOFDAY
        {
            struct timeval tv_begin, tv_end;

            _libssh2_gettimeofday((struct timeval *) &tv_begin, NULL);
            sysret = select(maxfd+1, &rfds, &wfds, NULL, &tv);
            _libssh2_gettimeofday((struct timeval *) &tv_end, NULL);

            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }
#else
        /* If the platform doesn't support gettimeofday,
         * then just make the call non-blocking and walk away
         */
        sysret = select(maxfd+1, &rfds, &wfds, NULL, &tv);
        timeout_remaining = 0;
#endif

        if (sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch (fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    if (FD_ISSET(fds[i].fd.socket, &rfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLIN;
                    }
                    if (FD_ISSET(fds[i].fd.socket, &wfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLOUT;
                    }
                    if (fds[i].revents) {
                        active_fds++;
                    }
                    break;

                case LIBSSH2_POLLFD_CHANNEL:
                    if (FD_ISSET(fds[i].fd.channel->session->socket_fd, &rfds)) {
                        /* Spin session until no data available */
                        while (_libssh2_transport_read(fds[i].fd.channel->session)
                               > 0);
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if (FD_ISSET
                        (fds[i].fd.listener->session->socket_fd, &rfds)) {
                        /* Spin session until no data available */
                        while (_libssh2_transport_read(fds[i].fd.listener->session)
                               > 0);
                    }
                    break;
                }
            }
        }
#endif /* else no select() or poll() -- timeout (and by extension
        * timeout_remaining) will be equal to 0 */
    } while ((timeout_remaining > 0) && !active_fds);

    return active_fds;
}